

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectMaterial(XFileParser *this,Material *pMaterial)

{
  bool bVar1;
  Logger *this_00;
  ai_real aVar2;
  aiColor4D aVar3;
  string texname;
  string objectName;
  string matName;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [32];
  bool local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&local_50);
  if (local_50._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_70,"material",&local_b9);
    to_string<unsigned_int>(&local_b8,this->mLineNumber);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   &local_70,&local_b8);
    std::__cxx11::string::operator=((string *)&local_50,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::_M_assign((string *)pMaterial);
  pMaterial->mIsReference = false;
  aVar3 = ReadRGBA(this);
  pMaterial->mDiffuse = aVar3;
  aVar2 = ReadFloat(this);
  pMaterial->mSpecularExponent = aVar2;
  ReadRGB((XFileParser *)local_98);
  (pMaterial->mSpecular).r = (ai_real)local_98._0_4_;
  (pMaterial->mSpecular).g = (ai_real)local_98._4_4_;
  (pMaterial->mSpecular).b = (ai_real)local_98._8_4_;
  ReadRGB((XFileParser *)local_98);
  (pMaterial->mEmissive).r = (ai_real)local_98._0_4_;
  (pMaterial->mEmissive).g = (ai_real)local_98._4_4_;
  (pMaterial->mEmissive).b = (ai_real)local_98._8_4_;
  do {
    GetNextToken_abi_cxx11_(&local_70,this);
    if ((Scene *)local_70._M_string_length == (Scene *)0x0) {
      std::__cxx11::string::string
                ((string *)local_98,"Unexpected end of file while parsing mesh material",
                 (allocator *)&local_b8);
      ThrowException(this,(string *)local_98);
    }
    bVar1 = std::operator==(&local_70,"}");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return;
    }
    bVar1 = std::operator==(&local_70,"TextureFilename");
    if (bVar1) {
LAB_0053bc21:
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      ParseDataObjectTextureFilename(this,&local_b8);
      std::__cxx11::string::string((string *)local_98,(string *)&local_b8);
      local_78 = false;
      std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::
      emplace_back<Assimp::XFile::TexEntry>(&pMaterial->mTextures,(TexEntry *)local_98);
LAB_0053bc5c:
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      bVar1 = std::operator==(&local_70,"TextureFileName");
      if (bVar1) goto LAB_0053bc21;
      bVar1 = std::operator==(&local_70,"NormalmapFilename");
      if (bVar1) {
LAB_0053bc9f:
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        ParseDataObjectTextureFilename(this,&local_b8);
        std::__cxx11::string::string((string *)local_98,(string *)&local_b8);
        local_78 = true;
        std::vector<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>::
        emplace_back<Assimp::XFile::TexEntry>(&pMaterial->mTextures,(TexEntry *)local_98);
        goto LAB_0053bc5c;
      }
      bVar1 = std::operator==(&local_70,"NormalmapFileName");
      if (bVar1) goto LAB_0053bc9f;
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"Unknown data object in material in x file");
      ParseUnknownDataObject(this);
    }
    std::__cxx11::string::~string((string *)&local_70);
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectMaterial( Material* pMaterial)
{
    std::string matName;
    readHeadOfDataObject( &matName);
    if( matName.empty())
        matName = std::string( "material") + to_string( mLineNumber );
    pMaterial->mName = matName;
    pMaterial->mIsReference = false;

    // read material values
    pMaterial->mDiffuse = ReadRGBA();
    pMaterial->mSpecularExponent = ReadFloat();
    pMaterial->mSpecular = ReadRGB();
    pMaterial->mEmissive = ReadRGB();

    // read other data objects
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.size() == 0)
            ThrowException( "Unexpected end of file while parsing mesh material");
        else
        if( objectName == "}")
            break; // material finished
        else
        if( objectName == "TextureFilename" || objectName == "TextureFileName")
        {
            // some exporters write "TextureFileName" instead.
            std::string texname;
            ParseDataObjectTextureFilename( texname);
            pMaterial->mTextures.push_back( TexEntry( texname));
        } else
        if( objectName == "NormalmapFilename" || objectName == "NormalmapFileName")
        {
            // one exporter writes out the normal map in a separate filename tag
            std::string texname;
            ParseDataObjectTextureFilename( texname);
            pMaterial->mTextures.push_back( TexEntry( texname, true));
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in material in x file");
            ParseUnknownDataObject();
        }
    }
}